

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<int>::Swap(RepeatedField<int> *this,RepeatedField<int> *other)

{
  bool bVar1;
  Arena *lhs;
  undefined1 local_38 [8];
  RepeatedField<int> temp;
  Arena *other_arena;
  Arena *arena;
  RepeatedField<int> *other_local;
  RepeatedField<int> *this_local;
  
  if (this != other) {
    lhs = GetArena(this);
    temp.soo_rep_.field_0.short_rep.field_1 =
         (anon_union_8_2_4f9aec01_for_ShortSooRep_1)GetArena(other);
    bVar1 = internal::CanUseInternalSwap(lhs,(Arena *)temp.soo_rep_.field_0.short_rep.field_1);
    if (bVar1) {
      InternalSwap(this,other);
    }
    else {
      RepeatedField((RepeatedField<int> *)local_38,(Arena *)temp.soo_rep_.field_0.short_rep.field_1)
      ;
      MergeFrom((RepeatedField<int> *)local_38,this);
      CopyFrom(this,other);
      UnsafeArenaSwap(other,(RepeatedField<int> *)local_38);
      ~RepeatedField((RepeatedField<int> *)local_38);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  Arena* arena = GetArena();
  Arena* other_arena = other->GetArena();
  if (internal::CanUseInternalSwap(arena, other_arena)) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other_arena);
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}